

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_keeper.h
# Opt level: O3

void __thiscall
mp::
ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::NLBaseReif<1>_>
::ExportConStatus(ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::NLBaseReif<1>_>
                  *this,int i_con,Container *cnt,ItemNamer *vnam,bool add2final)

{
  char *pcVar1;
  char cVar2;
  uint uVar3;
  size_t sVar4;
  BasicMemoryWriter<char,_std::allocator<char>_> *pBVar5;
  int iVar6;
  _func_int **pp_Var7;
  BasicLogger *pBVar8;
  string_view key;
  string_view key_00;
  string_view key_01;
  string_view key_02;
  string_view key_03;
  string_view key_04;
  string_view key_05;
  string_view key_06;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> jw;
  MemoryWriter pr;
  MemoryWriter wrt;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> local_4b8;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> local_4a8;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> local_498;
  BasicMemoryWriter<char,_std::allocator<char>_> local_488;
  BasicMemoryWriter<char,_std::allocator<char>_> local_258;
  
  pBVar8 = (this->super_BasicConstraintKeeper).exporter_;
  if (pBVar8 == (BasicLogger *)0x0) {
    return;
  }
  iVar6 = (*pBVar8->_vptr_BasicLogger[2])();
  if ((char)iVar6 != '\0') {
    if ((this->super_BasicConstraintKeeper).exporter_ != (BasicLogger *)0x0) {
      local_258.super_BasicWriter<char>.buffer_ = &local_258.buffer_.super_Buffer<char>;
      local_258.super_BasicWriter<char>._vptr_BasicWriter =
           (_func_int **)&PTR__BasicMemoryWriter_005c3958;
      local_258.buffer_.super_Buffer<char>.ptr_ = local_258.buffer_.data_;
      local_258.buffer_.super_Buffer<char>.size_ = 0;
      local_258.buffer_.super_Buffer<char>.capacity_ = 500;
      local_258.buffer_.super_Buffer<char>._vptr_Buffer = (_func_int **)&PTR_grow_005c39a0;
      local_4a8.wrt_ = &local_258;
      local_4a8.kind_ = Unset;
      local_4a8.n_written_ = 0;
      pp_Var7 = (_func_int **)
                BasicConstraintKeeper::GetShortTypeName(&this->super_BasicConstraintKeeper);
      key._M_str = (char *)0x8;
      key._M_len = (size_t)&local_4a8;
      MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
                (&local_4b8,key);
      if (local_4b8.kind_ == Unset) {
        local_4b8.kind_ = Scalar;
      }
      local_488.super_BasicWriter<char>._vptr_BasicWriter = pp_Var7;
      fmt::BasicWriter<char>::write
                (&(local_4b8.wrt_)->super_BasicWriter<char>,0x4a01ca,(void *)0xa,(size_t)&local_488)
      ;
      local_4b8.n_written_ = local_4b8.n_written_ + 1;
      MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_4b8);
      MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_4b8);
      key_00._M_str = (char *)0x5;
      key_00._M_len = (size_t)&local_4a8;
      MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
                (&local_4b8,key_00);
      if (local_4b8.kind_ == Unset) {
        local_4b8.kind_ = Scalar;
      }
      local_488.super_BasicWriter<char>._vptr_BasicWriter = (_func_int **)(ulong)(uint)i_con;
      fmt::BasicWriter<char>::write
                (&(local_4b8.wrt_)->super_BasicWriter<char>,0x4baf35,(void *)0x2,(size_t)&local_488)
      ;
      local_4b8.n_written_ = local_4b8.n_written_ + 1;
      MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_4b8);
      MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_4b8);
      pp_Var7 = (_func_int **)(cnt->con_).con_flat_.super_BasicConstraint.name_._M_dataplus._M_p;
      if (*(char *)pp_Var7 != '\0') {
        key_01._M_str = (char *)0x4;
        key_01._M_len = (size_t)&local_4a8;
        MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
                  (&local_4b8,key_01);
        if (local_4b8.kind_ == Unset) {
          local_4b8.kind_ = Scalar;
        }
        local_488.super_BasicWriter<char>._vptr_BasicWriter = pp_Var7;
        fmt::BasicWriter<char>::write
                  (&(local_4b8.wrt_)->super_BasicWriter<char>,0x4a01ca,(void *)0xa,
                   (size_t)&local_488);
        local_4b8.n_written_ = local_4b8.n_written_ + 1;
        MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_4b8);
        MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_4b8);
        local_488.super_BasicWriter<char>.buffer_ = &local_488.buffer_.super_Buffer<char>;
        local_488.super_BasicWriter<char>._vptr_BasicWriter =
             (_func_int **)&PTR__BasicMemoryWriter_005c3958;
        pcVar1 = local_488.buffer_.data_;
        local_488.buffer_.super_Buffer<char>.size_ = 0;
        local_488.buffer_.super_Buffer<char>.capacity_ = 500;
        local_488.buffer_.super_Buffer<char>._vptr_Buffer = (_func_int **)&PTR_grow_005c39a0;
        local_488.buffer_.super_Buffer<char>.ptr_ = pcVar1;
        WriteFlatCon<fmt::BasicMemoryWriter<char,std::allocator<char>>,mp::NLBaseReif<1>>
                  (&local_488,(NLBaseReif<1> *)cnt,vnam);
        sVar4 = (local_488.super_BasicWriter<char>.buffer_)->size_;
        if ((local_488.super_BasicWriter<char>.buffer_)->capacity_ < sVar4 + 1) {
          (**((Buffer<char> *)&(local_488.super_BasicWriter<char>.buffer_)->_vptr_Buffer)->
             _vptr_Buffer)();
        }
        (local_488.super_BasicWriter<char>.buffer_)->ptr_[sVar4] = '\0';
        pBVar5 = (BasicMemoryWriter<char,_std::allocator<char>_> *)
                 (local_488.super_BasicWriter<char>.buffer_)->ptr_;
        key_02._M_str = (char *)0x7;
        key_02._M_len = (size_t)&local_4a8;
        MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
                  (&local_498,key_02);
        if (local_498.kind_ == Unset) {
          local_498.kind_ = Scalar;
        }
        local_4b8.wrt_ = pBVar5;
        fmt::BasicWriter<char>::write
                  (&(local_498.wrt_)->super_BasicWriter<char>,0x4a01ca,(void *)0xa,
                   (size_t)&local_4b8);
        local_498.n_written_ = local_498.n_written_ + 1;
        MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_498);
        MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_498);
        local_488.super_BasicWriter<char>._vptr_BasicWriter =
             (_func_int **)&PTR__BasicMemoryWriter_005c3958;
        local_488.buffer_.super_Buffer<char>._vptr_Buffer = (_func_int **)&PTR_grow_005c39a0;
        if (local_488.buffer_.super_Buffer<char>.ptr_ != pcVar1) {
          operator_delete(local_488.buffer_.super_Buffer<char>.ptr_,
                          local_488.buffer_.super_Buffer<char>.capacity_);
        }
      }
      uVar3 = cnt->depth_;
      key_03._M_str = (char *)0x5;
      key_03._M_len = (size_t)&local_4a8;
      MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
                (&local_4b8,key_03);
      if (local_4b8.kind_ == Unset) {
        local_4b8.kind_ = Scalar;
      }
      local_488.super_BasicWriter<char>._vptr_BasicWriter = (_func_int **)(ulong)uVar3;
      fmt::BasicWriter<char>::write
                (&(local_4b8.wrt_)->super_BasicWriter<char>,0x4baf35,(void *)0x2,(size_t)&local_488)
      ;
      local_4b8.n_written_ = local_4b8.n_written_ + 1;
      MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_4b8);
      MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_4b8);
      cVar2 = cnt->is_unused_;
      key_04._M_str = (char *)0x6;
      key_04._M_len = (size_t)&local_4a8;
      MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
                (&local_4b8,key_04);
      if (local_4b8.kind_ == Unset) {
        local_4b8.kind_ = Scalar;
      }
      local_488.super_BasicWriter<char>._vptr_BasicWriter = (_func_int **)(ulong)(cVar2 != '\0');
      fmt::BasicWriter<char>::write
                (&(local_4b8.wrt_)->super_BasicWriter<char>,0x4baf35,(void *)0x2,(size_t)&local_488)
      ;
      local_4b8.n_written_ = local_4b8.n_written_ + 1;
      MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_4b8);
      MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_4b8);
      cVar2 = cnt->is_bridged_;
      key_05._M_str = (char *)0x7;
      key_05._M_len = (size_t)&local_4a8;
      MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
                (&local_4b8,key_05);
      if (local_4b8.kind_ == Unset) {
        local_4b8.kind_ = Scalar;
      }
      local_488.super_BasicWriter<char>._vptr_BasicWriter = (_func_int **)(ulong)(cVar2 != '\0');
      fmt::BasicWriter<char>::write
                (&(local_4b8.wrt_)->super_BasicWriter<char>,0x4baf35,(void *)0x2,(size_t)&local_488)
      ;
      local_4b8.n_written_ = local_4b8.n_written_ + 1;
      MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_4b8);
      MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_4b8);
      key_06._M_str = (char *)0x5;
      key_06._M_len = (size_t)&local_4a8;
      MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
                (&local_4b8,key_06);
      if (local_4b8.kind_ == Unset) {
        local_4b8.kind_ = Scalar;
      }
      local_488.super_BasicWriter<char>._vptr_BasicWriter = (_func_int **)(ulong)add2final;
      fmt::BasicWriter<char>::write
                (&(local_4b8.wrt_)->super_BasicWriter<char>,0x4baf35,(void *)0x2,(size_t)&local_488)
      ;
      local_4b8.n_written_ = local_4b8.n_written_ + 1;
      MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_4b8);
      MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_4b8);
      MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_4a8);
      local_488.super_BasicWriter<char>._vptr_BasicWriter = (_func_int **)0x0;
      local_488.super_BasicWriter<char>.buffer_ = (Buffer<char> *)0x0;
      fmt::BasicWriter<char>::write
                (&local_258.super_BasicWriter<char>,0x4b6c83,(void *)0x0,(size_t)&local_488);
      pBVar8 = (this->super_BasicConstraintKeeper).exporter_;
      if ((pBVar8 == (BasicLogger *)0x0) ||
         (iVar6 = (*pBVar8->_vptr_BasicLogger[2])(), (char)iVar6 == '\0')) {
        pBVar8 = (BasicLogger *)0x0;
      }
      else {
        pBVar8 = (this->super_BasicConstraintKeeper).exporter_;
      }
      BasicLogger::Append<fmt::BasicMemoryWriter<char,std::allocator<char>>>(pBVar8,&local_258);
      local_258.super_BasicWriter<char>._vptr_BasicWriter =
           (_func_int **)&PTR__BasicMemoryWriter_005c3958;
      local_258.buffer_.super_Buffer<char>._vptr_Buffer = (_func_int **)&PTR_grow_005c39a0;
      if (local_258.buffer_.super_Buffer<char>.ptr_ != local_258.buffer_.data_) {
        operator_delete(local_258.buffer_.super_Buffer<char>.ptr_,
                        local_258.buffer_.super_Buffer<char>.capacity_);
      }
      return;
    }
    return;
  }
  return;
}

Assistant:

void ExportConStatus(int i_con, const Container& cnt,
                       ItemNamer& vnam, bool add2final) {
    if (GetLogger()) {
      fmt::MemoryWriter wrt;
      {
        MiniJSONWriter jw(wrt);
        jw["CON_TYPE"] = GetShortTypeName();
        jw["index"] = i_con;
        if (*cnt.GetCon().name()) {
          jw["name"] = cnt.GetCon().name();
          {
            fmt::MemoryWriter pr;
            WriteFlatCon(pr, cnt.GetCon(), vnam);
            jw["printed"] = pr.c_str();
          }
        }
        jw["depth"] = cnt.GetDepth();
        jw["unused"] = (int)cnt.IsUnused();
        jw["bridged"] = (int)cnt.IsBridged();
        jw["final"] = (int)add2final;
      }
      wrt.write("\n");                     // EOL
      GetLogger()->Append(wrt);
    }
  }